

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_DumpGraphIntoFile(Emb_Man_t *p)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  int local_30;
  uint local_2c;
  int k;
  int i;
  Emb_Obj_t *pNext;
  Emb_Obj_t *pThis;
  FILE *pFile;
  Emb_Man_t *p_local;
  
  __stream = fopen("1.g","w");
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if ((int)local_2c < p->nObjData) {
      pNext = Emb_ManObj(p,local_2c);
      bVar2 = pNext != (Emb_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Emb_ObjIsTravIdCurrent(p,pNext);
    if (iVar1 != 0) {
      local_30 = 0;
      while( true ) {
        bVar2 = false;
        if (local_30 < (int)pNext->nFanouts) {
          _k = Emb_ObjFanout(pNext,local_30);
          bVar2 = _k != (Emb_Obj_t *)0x0;
        }
        if (!bVar2) break;
        iVar1 = Emb_ObjIsTravIdCurrent(p,_k);
        if (iVar1 == 0) {
          __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                        ,0x43c,"void Emb_DumpGraphIntoFile(Emb_Man_t *)");
        }
        fprintf(__stream,"%d %d\n",(ulong)(pNext->field_8).Value,(ulong)(_k->field_8).Value);
        local_30 = local_30 + 1;
      }
    }
    iVar1 = Emb_ObjSize(pNext);
    local_2c = iVar1 + local_2c;
  }
  fclose(__stream);
  return;
}

Assistant:

void Emb_DumpGraphIntoFile( Emb_Man_t * p )
{
    FILE * pFile;
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    pFile = fopen( "1.g", "w" );
    Emb_ManForEachObj( p, pThis, i )
    {
        if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjForEachFanout( pThis, pNext, k )
        {
            assert( Emb_ObjIsTravIdCurrent(p, pNext) );
            fprintf( pFile, "%d %d\n", pThis->Value, pNext->Value );
        }
    }
    fclose( pFile );
}